

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.c
# Opt level: O1

size_t Qiniu_Seq_Read(void *buf,size_t unused,size_t n,Qiniu_Seq *self)

{
  ulong uVar1;
  
  uVar1 = self->limit - self->off;
  if (uVar1 == 0) {
    n = 0;
  }
  else {
    if (uVar1 < n) {
      n = uVar1;
    }
    if (n != 0) {
      uVar1 = 0;
      do {
        *(char *)((long)buf + uVar1) =
             (char)((self->delta + self->off + uVar1) % (ulong)(long)self->radix) + (char)self->base
        ;
        uVar1 = uVar1 + 1;
      } while (n != uVar1);
    }
    self->off = self->off + n;
  }
  return n;
}

Assistant:

static size_t Qiniu_Seq_Read(void *buf, size_t unused, size_t n, Qiniu_Seq *self)
{
	char *p = (char *)buf;
	size_t i, max = self->limit - self->off;
	if (max <= 0)
	{
		return 0;
	}
	if (n > max)
	{
		n = (size_t)max;
	}
	for (i = 0; i < n; i++)
	{
		p[i] = (self->off + self->delta + i) % self->radix + self->base;
	}
	self->off += n;
	return n;
}